

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::ls_solver(ls_solver *this)

{
  Mersenne *in_RDI;
  Mersenne *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::vector
            ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)0x163a93);
  std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::vector
            ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)0x163aa6);
  in_RDI->mt[0x14] = 0;
  in_RDI->mt[0x15] = 0;
  in_RDI->mt[0x16] = 0;
  in_RDI->mt[0x17] = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x163ac9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x163adc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x163af2);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x163b08);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x163b1e);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x163b34);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x163b4a);
  in_RDI->mt[0x44] = 0;
  in_RDI->mt[0x45] = 0;
  in_RDI->mt[0x46] = 0;
  in_RDI->mt[0x47] = 0;
  in_RDI->mt[0x48] = 0;
  in_RDI->mt[0x49] = 0;
  Mersenne::Mersenne(this_00);
  this_00[1].mt[0x53] = 0;
  this_00[1].mt[0x57] = 0;
  this_00[1].mt[0x59] = 0;
  this_00[1].mt[0x5a] = 0;
  this_00[1].mt[0x5b] = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x163bb8);
  this_00->mt[0x18] = 10;
  this_00->mt[0x50] = 1;
  this_00->mt[0x4e] = 900000000;
  this_00->mt[0x4f] = 0;
  this_00->mt[0x4c] = 100000000;
  this_00->mt[0x4d] = 0;
  this_00[1].mt[0x51] = 1;
  this_00[1].mt[0x54] = 0x32;
  this_00[1].mt[0x55] = 0x3e99999a;
  this_00[1].mt[0x56] = 0x3f333333;
  *(undefined1 *)(this_00[1].mt + 0x52) = 1;
  this_00->mt[0x4a] = 0;
  this_00->mt[0x4b] = 0;
  this_00[1].mt[0x5c] = 0x3a83126f;
  return;
}

Assistant:

ls_solver::ls_solver()
  : _num_vars(0)
  , _num_clauses(0)
  , _best_found_cost(0)
  , _best_cost_time(0)
  , _step(0)
  , _aspiration_score(0)
  , _avg_clause_weight(0)
  , _delta_total_clause_weight(0)
  , _init_unsat_nums(0)
{
    _additional_len = 10;
    _max_tries = 1;                 // 100
    _max_steps = 900 * 1000 * 1000; // 2 0000 0000
    _max_mems = 100 * 1000 * 1000;
    _random_seed = 1;
    // _time_limit = 3000;
    _swt_threshold = 50;
    _swt_p = 0.3;
    _swt_q = 0.7;
    _aspiration_active = true;
    _mems = 0;
    _prob_p = 0.001;
}